

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O3

int Ivy_CutFindOrAddFilter(Ivy_Store_t *pCutStore,Ivy_Cut_t *pCutNew)

{
  Ivy_Cut_t *pIVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  short sVar9;
  short sVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  
  uVar4 = pCutNew->uHash;
  if (uVar4 == 0) {
    __assert_fail("pCutNew->uHash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                  ,0x36d,"int Ivy_CutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  iVar5 = pCutStore->nCuts;
  lVar12 = (long)iVar5;
  if (0 < lVar12) {
    piVar15 = pCutStore->pCuts[0].pArray;
    lVar16 = 0;
    do {
      uVar2 = pCutStore->pCuts[lVar16].nSize;
      uVar11 = (uint)(short)uVar2;
      if (uVar2 != 0) {
        uVar3 = pCutNew->nSize;
        if (uVar2 == uVar3) {
          if (pCutStore->pCuts[lVar16].uHash == uVar4) {
            if ((short)uVar2 < 1) {
              uVar17 = 0;
            }
            else {
              uVar17 = 0;
              while (piVar15[uVar17] == pCutNew->pArray[uVar17]) {
                uVar17 = uVar17 + 1;
                if (uVar11 == uVar17) {
                  return 1;
                }
              }
            }
            if ((uint)uVar17 == uVar11) {
              return 1;
            }
          }
        }
        else {
          uVar6 = pCutStore->pCuts[lVar16].uHash;
          uVar13 = uVar6 & uVar4;
          if ((short)uVar2 < (short)uVar3) {
            if (uVar13 == uVar6) {
              if ((short)uVar2 < 1) {
                return 1;
              }
              lVar18 = 0;
              do {
                if (lVar18 == 0) {
                  iVar14 = pCutStore->pCuts[lVar16].pArray[0];
                }
                else {
                  iVar14 = pCutStore->pCuts[lVar16].pArray[lVar18];
                  if (iVar14 <= pCutStore->pCuts[lVar16].pArray[lVar18 + -1]) {
LAB_007651ee:
                    __assert_fail("i==0 || pDom->pArray[i-1] < pDom->pArray[i]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                  ,0x353,"int Ivy_CutCheckDominance(Ivy_Cut_t *, Ivy_Cut_t *)");
                  }
                }
                uVar17 = 0;
                while (iVar14 != pCutNew->pArray[uVar17]) {
                  uVar17 = uVar17 + 1;
                  if ((uint)(int)(short)uVar3 == uVar17) goto LAB_007651a6;
                }
                if ((int)(short)uVar3 == (uint)uVar17) break;
                lVar18 = lVar18 + 1;
                if (lVar18 == (int)uVar11) {
                  return 1;
                }
              } while( true );
            }
          }
          else if (uVar13 == uVar4) {
            if (0 < (short)uVar3) {
              uVar17 = 0;
              do {
                if (uVar17 == 0) {
                  iVar14 = pCutNew->pArray[0];
                }
                else {
                  iVar14 = pCutNew->pArray[uVar17];
                  if (iVar14 <= pCutNew->pArray[uVar17 - 1]) goto LAB_007651ee;
                }
                uVar19 = 0;
                while (iVar14 != piVar15[uVar19]) {
                  uVar19 = uVar19 + 1;
                  if (uVar11 == uVar19) goto LAB_007651a6;
                }
                if (uVar11 == (uint)uVar19) goto LAB_007651a6;
                uVar17 = uVar17 + 1;
              } while (uVar17 != uVar3);
            }
            pCutStore->pCuts[lVar16].nSize = 0;
          }
        }
      }
LAB_007651a6:
      lVar16 = lVar16 + 1;
      piVar15 = piVar15 + 9;
    } while (lVar16 != lVar12);
  }
  if (pCutStore->nCutsMax <= iVar5) {
    __assert_fail("pCutStore->nCuts < pCutStore->nCutsMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                  ,0x396,"int Ivy_CutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  pCutStore->nCuts = iVar5 + 1;
  pCutStore->pCuts[lVar12].uHash = pCutNew->uHash;
  iVar5 = pCutNew->nLatches;
  sVar9 = pCutNew->nSize;
  sVar10 = pCutNew->nSizeMax;
  uVar7 = *(undefined8 *)pCutNew->pArray;
  uVar8 = *(undefined8 *)(pCutNew->pArray + 4);
  piVar15 = pCutStore->pCuts[lVar12].pArray;
  *(undefined8 *)(piVar15 + 2) = *(undefined8 *)(pCutNew->pArray + 2);
  *(undefined8 *)(piVar15 + 4) = uVar8;
  pIVar1 = pCutStore->pCuts + lVar12;
  pIVar1->nLatches = iVar5;
  pIVar1->nSize = sVar9;
  pIVar1->nSizeMax = sVar10;
  *(undefined8 *)pIVar1->pArray = uVar7;
  return 0;
}

Assistant:

int Ivy_CutFindOrAddFilter( Ivy_Store_t * pCutStore, Ivy_Cut_t * pCutNew )
{
    Ivy_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uHash );
    // try to find the cut
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        if ( pCut->nSize == pCutNew->nSize )
        {
            if ( pCut->uHash == pCutNew->uHash )
            {
                for ( k = 0; k < pCutNew->nSize; k++ )
                    if ( pCut->pArray[k] != pCutNew->pArray[k] )
                        break;
                if ( k == pCutNew->nSize )
                    return 1;
            }
            continue;
        }
        if ( pCut->nSize < pCutNew->nSize )
        {
            // skip the non-contained cuts
            if ( (pCut->uHash & pCutNew->uHash) != pCut->uHash )
                continue;
            // check containment seriously
            if ( Ivy_CutCheckDominance( pCut, pCutNew ) )
                return 1;
            continue;
        }
        // check potential containment of other cut

        // skip the non-contained cuts
        if ( (pCut->uHash & pCutNew->uHash) != pCutNew->uHash )
            continue;
        // check containment seriously
        if ( Ivy_CutCheckDominance( pCutNew, pCut ) )
        {
            // remove the current cut
            pCut->nSize = 0;
        }
    }
    assert( pCutStore->nCuts < pCutStore->nCutsMax );
    // add the cut
    pCut = pCutStore->pCuts + pCutStore->nCuts++;
    *pCut = *pCutNew;
    return 0;
}